

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<TPZEqnArray<float>,_10> * __thiscall
TPZManVector<TPZEqnArray<float>,_10>::operator=
          (TPZManVector<TPZEqnArray<float>,_10> *this,TPZManVector<TPZEqnArray<float>,_10> *copy)

{
  long lVar1;
  undefined1 auVar2 [16];
  TPZEqnArray<float> *pTVar3;
  TPZEqnArray<float> *pTVar4;
  ulong uVar5;
  ulong *puVar6;
  TPZEqnArray<float> *pTVar7;
  TPZVec<TPZEqnArray<float>_> *in_RSI;
  TPZVec<TPZEqnArray<float>_> *in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t nel;
  TPZEqnArray<float> *in_stack_ffffffffffffff28;
  TPZEqnArray<float> *in_stack_ffffffffffffff30;
  TPZEqnArray<float> *local_b0;
  TPZEqnArray<float> *pTVar9;
  long local_30;
  
  if (in_RDI != in_RSI) {
    pTVar3 = (TPZEqnArray<float> *)TPZVec<TPZEqnArray<float>_>::NElements(in_RSI);
    if (((in_RDI->fNAlloc < (long)pTVar3) && (in_RDI->fStore != (TPZEqnArray<float> *)0x0)) &&
       (in_RDI->fStore != (TPZEqnArray<float> *)(in_RDI + 1))) {
      pTVar9 = in_RDI->fStore;
      if (pTVar9 != (TPZEqnArray<float> *)0x0) {
        lVar1 = *(long *)&pTVar9[-1].fLastTerm;
        for (pTVar4 = pTVar9 + lVar1; pTVar9 != pTVar4; pTVar4 = pTVar4 + -1) {
          TPZEqnArray<float>::~TPZEqnArray(in_stack_ffffffffffffff30);
        }
        operator_delete__(&pTVar9[-1].fLastTerm,lVar1 * 0x22f0 + 8);
      }
      in_RDI->fStore = (TPZEqnArray<float> *)0x0;
      in_RDI->fNAlloc = 0;
    }
    if ((long)pTVar3 < 0xb) {
      if ((in_RDI->fStore != (TPZEqnArray<float> *)(in_RDI + 1)) &&
         (pTVar9 = in_RDI->fStore, pTVar9 != (TPZEqnArray<float> *)0x0)) {
        lVar1 = *(long *)&pTVar9[-1].fLastTerm;
        for (pTVar4 = pTVar9 + lVar1; pTVar9 != pTVar4; pTVar4 = pTVar4 + -1) {
          TPZEqnArray<float>::~TPZEqnArray(in_stack_ffffffffffffff30);
        }
        operator_delete__(&pTVar9[-1].fLastTerm,lVar1 * 0x22f0 + 8);
      }
      in_RDI->fNAlloc = 0;
      in_RDI->fStore = (TPZEqnArray<float> *)(in_RDI + 1);
      in_RDI->fNElements = (int64_t)pTVar3;
    }
    else if (in_RDI->fNAlloc < (long)pTVar3) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pTVar3;
      uVar5 = SUB168(auVar2 * ZEXT816(0x22f0),0);
      uVar8 = uVar5 + 8;
      if (SUB168(auVar2 * ZEXT816(0x22f0),8) != 0 || 0xfffffffffffffff7 < uVar5) {
        uVar8 = 0xffffffffffffffff;
      }
      pTVar9 = pTVar3;
      puVar6 = (ulong *)operator_new__(uVar8);
      *puVar6 = (ulong)pTVar9;
      pTVar4 = (TPZEqnArray<float> *)(puVar6 + 1);
      if (pTVar9 != (TPZEqnArray<float> *)0x0) {
        pTVar7 = pTVar4 + (long)pTVar9;
        local_b0 = pTVar4;
        do {
          TPZEqnArray<float>::TPZEqnArray(pTVar9);
          local_b0 = local_b0 + 1;
        } while (local_b0 != pTVar7);
      }
      in_RDI->fStore = pTVar4;
      in_RDI->fNAlloc = (int64_t)pTVar3;
      in_RDI->fNElements = (int64_t)pTVar3;
    }
    else {
      in_RDI->fNElements = (int64_t)pTVar3;
    }
    for (local_30 = 0; local_30 < (long)pTVar3; local_30 = local_30 + 1) {
      TPZEqnArray<float>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  return (TPZManVector<TPZEqnArray<float>,_10> *)in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}